

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O0

int64_t av1_block_error_lp_avx2(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  undefined1 auVar1 [16];
  long in_RDX;
  undefined1 auVar2 [32];
  __m256i *unaff_retaddr;
  int16_t *in_stack_00000008;
  __m128i sse_128;
  __m256i sse_hi;
  int64_t sse;
  __m256i sse_256;
  intptr_t in_stack_000001b8;
  __m256i *in_stack_000001c0;
  int16_t *in_stack_000001c8;
  int16_t *in_stack_000001d0;
  undefined8 local_190;
  undefined1 local_140 [32];
  
  local_140 = ZEXT1632(ZEXT816(0));
  if (in_RDX == 0x10) {
    av1_block_error_block_size16_avx2((int16_t *)0x0,(int16_t *)0x0,(__m256i *)0x0);
  }
  else if (in_RDX == 0x20) {
    av1_block_error_block_size32_avx2((int16_t *)sse_128[0],in_stack_00000008,unaff_retaddr);
  }
  else {
    av1_block_error_block_size64_avx2
              (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
  }
  auVar2 = vpsrldq_avx2(local_140,8);
  auVar2 = vpaddq_avx2(local_140,auVar2);
  auVar1 = vpaddq_avx(auVar2._0_16_,auVar2._16_16_);
  local_190 = auVar1._0_8_;
  return local_190;
}

Assistant:

int64_t av1_block_error_lp_avx2(const int16_t *coeff, const int16_t *dqcoeff,
                                intptr_t block_size) {
  assert(block_size % 16 == 0);
  __m256i sse_256 = _mm256_setzero_si256();
  int64_t sse;

  if (block_size == 16)
    av1_block_error_block_size16_avx2(coeff, dqcoeff, &sse_256);
  else if (block_size == 32)
    av1_block_error_block_size32_avx2(coeff, dqcoeff, &sse_256);
  else
    av1_block_error_block_size64_avx2(coeff, dqcoeff, &sse_256, block_size);

  // Save the higher 64 bit of each 128 bit lane.
  const __m256i sse_hi = _mm256_srli_si256(sse_256, 8);
  // Add the higher 64 bit to the low 64 bit.
  sse_256 = _mm256_add_epi64(sse_256, sse_hi);
  // Accumulate the sse_256 register to get final sse
  const __m128i sse_128 = _mm_add_epi64(_mm256_castsi256_si128(sse_256),
                                        _mm256_extractf128_si256(sse_256, 1));

  // Store the results.
  _mm_storel_epi64((__m128i *)&sse, sse_128);
  return sse;
}